

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::SkipField
               (CodedInputStream *input,uint32_t tag,UnknownFieldSet *unknown_fields)

{
  int iVar1;
  bool bVar2;
  string *buffer;
  UnknownFieldSet *unknown_fields_00;
  uint number;
  uint64_t value;
  undefined8 local_30;
  
  if (tag < 8) goto LAB_0022c70b;
  bVar2 = false;
  if (5 < (tag & 7)) {
    return false;
  }
  number = tag >> 3;
  switch(tag & 7) {
  case 0:
    bVar2 = io::CodedInputStream::ReadVarint64(input,&local_30);
    if (unknown_fields != (UnknownFieldSet *)0x0 && bVar2) {
      UnknownFieldSet::AddVarint(unknown_fields,number,CONCAT44(local_30._4_4_,(uint32_t)local_30));
    }
    break;
  case 1:
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,&local_30);
    if (unknown_fields != (UnknownFieldSet *)0x0 && bVar2) {
      UnknownFieldSet::AddFixed64(unknown_fields,number,CONCAT44(local_30._4_4_,(uint32_t)local_30))
      ;
    }
    break;
  case 2:
    bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&local_30);
    if (bVar2) {
      if (unknown_fields == (UnknownFieldSet *)0x0) {
        bVar2 = io::CodedInputStream::Skip(input,(uint32_t)local_30);
      }
      else {
        buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,number);
        bVar2 = io::CodedInputStream::ReadString(input,buffer,(uint32_t)local_30);
      }
      if (bVar2 != false) {
        return true;
      }
    }
    goto LAB_0022c70b;
  case 3:
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if (0 < iVar1) {
      if (unknown_fields == (UnknownFieldSet *)0x0) {
        unknown_fields_00 = (UnknownFieldSet *)0x0;
      }
      else {
        unknown_fields_00 = UnknownFieldSet::AddGroup(unknown_fields,number);
      }
      bVar2 = SkipMessage(input,unknown_fields_00);
      if (bVar2) {
        if (input->recursion_budget_ < input->recursion_limit_) {
          input->recursion_budget_ = input->recursion_budget_ + 1;
        }
        return input->last_tag_ == (tag & 0xfffffff8 | 4);
      }
    }
LAB_0022c70b:
    bVar2 = false;
    break;
  case 5:
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)&local_30);
    if (unknown_fields != (UnknownFieldSet *)0x0 && bVar2) {
      UnknownFieldSet::AddFixed32(unknown_fields,number,(uint32_t)local_30);
    }
  }
  return bVar2;
}

Assistant:

bool WireFormat::SkipField(io::CodedInputStream* input, uint32_t tag,
                           UnknownFieldSet* unknown_fields) {
  int number = WireFormatLite::GetTagFieldNumber(tag);
  // Field number 0 is illegal.
  if (number == 0) return false;

  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddVarint(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed64(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      if (unknown_fields == nullptr) {
        if (!input->Skip(length)) return false;
      } else {
        if (!input->ReadString(unknown_fields->AddLengthDelimited(number),
                               length)) {
          return false;
        }
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, (unknown_fields == nullptr)
                                  ? nullptr
                                  : unknown_fields->AddGroup(number))) {
        return false;
      }
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed32(number, value);
      return true;
    }
    default: {
      return false;
    }
  }
}